

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void lua_concat(lua_State *L,int n)

{
  undefined8 *puVar1;
  TString *pTVar2;
  int in_ESI;
  long in_RDI;
  TValue *i_o;
  undefined4 in_stack_00000008;
  lua_State *in_stack_00000018;
  int in_stack_00000028;
  int in_stack_0000002c;
  lua_State *in_stack_00000030;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI < 2) {
    if (in_ESI == 0) {
      puVar1 = *(undefined8 **)(in_RDI + 0x10);
      pTVar2 = luaS_newlstr(in_stack_00000018,(char *)L,CONCAT44(n,in_stack_00000008));
      *puVar1 = pTVar2;
      *(undefined4 *)(puVar1 + 1) = 4;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 0x10;
    }
  }
  else {
    if (*(ulong *)(*(long *)(in_RDI + 0x20) + 0x70) <= *(ulong *)(*(long *)(in_RDI + 0x20) + 0x78))
    {
      luaC_step((lua_State *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    }
    luaV_concat(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + (long)(in_ESI + -1) * -0x10;
  }
  return;
}

Assistant:

static void lua_concat(lua_State*L,int n){
api_checknelems(L,n);
if(n>=2){
luaC_checkGC(L);
luaV_concat(L,n,cast_int(L->top-L->base)-1);
L->top-=(n-1);
}
else if(n==0){
setsvalue(L,L->top,luaS_newlstr(L,"",0));
api_incr_top(L);
}
}